

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.c
# Opt level: O0

_Bool av1_resize_plane(uint8_t *input,int height,int width,int in_stride,uint8_t *output,int height2
                      ,int width2,int out_stride)

{
  void *pvVar1;
  void *pvVar2;
  uint8_t *arr;
  uint8_t *arr_00;
  undefined4 in_EDX;
  int in_ESI;
  undefined8 in_RDI;
  long in_R8;
  int in_R9D;
  uint8_t *unaff_retaddr;
  uint8_t *arrbuf2;
  uint8_t *arrbuf;
  uint8_t *tmpbuf;
  uint8_t *intbuf;
  _Bool mem_status;
  int i;
  _Bool local_29;
  int local_28;
  
  local_29 = true;
  pvVar1 = aom_malloc(0x6d53e3);
  pvVar2 = aom_malloc(0x6d5414);
  arr = (uint8_t *)aom_malloc(0x6d5427);
  arr_00 = (uint8_t *)aom_malloc(0x6d543a);
  if ((((pvVar1 == (void *)0x0) || (pvVar2 == (void *)0x0)) || (arr == (uint8_t *)0x0)) ||
     (arr_00 == (uint8_t *)0x0)) {
    local_29 = false;
  }
  else {
    for (local_28 = 0; local_28 < in_ESI; local_28 = local_28 + 1) {
      resize_multistep((uint8_t *)CONCAT44(arrbuf._4_4_,(int)arrbuf),arrbuf2._4_4_,unaff_retaddr,
                       (int)((ulong)in_RDI >> 0x20),(uint8_t *)CONCAT44(in_ESI,in_EDX));
    }
    for (local_28 = 0; local_28 < (int)arrbuf2; local_28 = local_28 + 1) {
      fill_col_to_arr((uint8_t *)((long)pvVar1 + (long)local_28),(int)arrbuf2,in_ESI,arr);
      resize_multistep((uint8_t *)CONCAT44(arrbuf._4_4_,(int)arrbuf),arrbuf2._4_4_,unaff_retaddr,
                       (int)((ulong)in_RDI >> 0x20),(uint8_t *)CONCAT44(in_ESI,in_EDX));
      fill_arr_to_col((uint8_t *)(in_R8 + local_28),(int)arrbuf,in_R9D,arr_00);
    }
  }
  aom_free(arr_00);
  aom_free(arr_00);
  aom_free(arr_00);
  aom_free(arr_00);
  return local_29;
}

Assistant:

bool av1_resize_plane(const uint8_t *input, int height, int width,
                      int in_stride, uint8_t *output, int height2, int width2,
                      int out_stride) {
  int i;
  bool mem_status = true;
  uint8_t *intbuf = (uint8_t *)aom_malloc(sizeof(uint8_t) * width2 * height);
  uint8_t *tmpbuf =
      (uint8_t *)aom_malloc(sizeof(uint8_t) * AOMMAX(width, height));
  uint8_t *arrbuf = (uint8_t *)aom_malloc(sizeof(uint8_t) * height);
  uint8_t *arrbuf2 = (uint8_t *)aom_malloc(sizeof(uint8_t) * height2);
  if (intbuf == NULL || tmpbuf == NULL || arrbuf == NULL || arrbuf2 == NULL) {
    mem_status = false;
    goto Error;
  }
  assert(width > 0);
  assert(height > 0);
  assert(width2 > 0);
  assert(height2 > 0);
  for (i = 0; i < height; ++i)
    resize_multistep(input + in_stride * i, width, intbuf + width2 * i, width2,
                     tmpbuf);
  for (i = 0; i < width2; ++i) {
    fill_col_to_arr(intbuf + i, width2, height, arrbuf);
    resize_multistep(arrbuf, height, arrbuf2, height2, tmpbuf);
    fill_arr_to_col(output + i, out_stride, height2, arrbuf2);
  }

Error:
  aom_free(intbuf);
  aom_free(tmpbuf);
  aom_free(arrbuf);
  aom_free(arrbuf2);
  return mem_status;
}